

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

int leveldb::anon_unknown_1::LockOrUnlock(int fd,bool lock)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = fcntl(fd,6);
  return iVar1;
}

Assistant:

int LockOrUnlock(int fd, bool lock) {
  errno = 0;
  struct ::flock file_lock_info;
  std::memset(&file_lock_info, 0, sizeof(file_lock_info));
  file_lock_info.l_type = (lock ? F_WRLCK : F_UNLCK);
  file_lock_info.l_whence = SEEK_SET;
  file_lock_info.l_start = 0;
  file_lock_info.l_len = 0;  // Lock/unlock entire file.
  return ::fcntl(fd, F_SETLK, &file_lock_info);
}